

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

size_t __thiscall wasm::WATParser::anon_unknown_10::LexCtx::startsWith(LexCtx *this,string_view sv)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  size_type __n;
  string_view local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  LexCtx *local_20;
  LexCtx *this_local;
  string_view sv_local;
  
  sv_local._M_len = (size_t)sv._M_str;
  this_local = (LexCtx *)sv._M_len;
  local_20 = this;
  local_40 = next(this);
  __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,__n);
  __y._M_str = (char *)sv_local._M_len;
  __y._M_len = (size_t)this_local;
  bVar1 = std::operator==(local_30,__y);
  return (ulong)bVar1;
}

Assistant:

size_t startsWith(std::string_view sv) const {
    return next().substr(0, sv.size()) == sv;
  }